

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# water.cpp
# Opt level: O2

shared_ptr<Image> runWaterEffect(Image *src,WaterEffectOptions *options)

{
  long lVar1;
  long lVar2;
  ostream *poVar3;
  runtime_error *this;
  long in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<Image> sVar4;
  __shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2> _Stack_48;
  shared_ptr<Histogram> hist;
  
  hist.super___shared_ptr<Histogram,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  hist.super___shared_ptr<Histogram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  src->pixels = (Pixel *)0x0;
  (src->raw).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  if (*(char *)(in_RDX + 0x28) == '\x01') {
    lVar1 = std::chrono::_V2::system_clock::now();
    runHistogramStage((Image *)&_Stack_48,options);
    std::__shared_ptr<Histogram,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&hist.super___shared_ptr<Histogram,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<Histogram,_(__gnu_cxx::_Lock_policy)2> *)&_Stack_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_48._M_refcount);
    lVar2 = std::chrono::_V2::system_clock::now();
    std::operator<<((ostream *)&std::cout,"Stage: Histogram:        ");
    poVar3 = std::ostream::_M_insert<double>((double)(lVar2 - lVar1) * 1e-09);
    poVar3 = std::operator<<(poVar3," s.");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  if (*(char *)(in_RDX + 0x29) == '\x01') {
    lVar1 = std::chrono::_V2::system_clock::now();
    if (hist.super___shared_ptr<Histogram,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0
       ) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Cannot run enhance stage without histogram.");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    runEnhanceStage((Image *)&_Stack_48,(Histogram *)options,
                    (WaterEffectOptions *)
                    hist.super___shared_ptr<Histogram,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    std::__shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2> *)src,&_Stack_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_48._M_refcount);
    lVar2 = std::chrono::_V2::system_clock::now();
    std::operator<<((ostream *)&std::cout,"Stage: Contrast enhance: ");
    poVar3 = std::ostream::_M_insert<double>((double)(lVar2 - lVar1) * 1e-09);
    poVar3 = std::operator<<(poVar3," s.");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  if (*(char *)(in_RDX + 0x2b) == '\x01') {
    lVar1 = std::chrono::_V2::system_clock::now();
    if ((WaterEffectOptions *)src->pixels == (WaterEffectOptions *)0x0) {
      runRippleStage((Image *)&_Stack_48,options);
    }
    else {
      runRippleStage((Image *)&_Stack_48,(WaterEffectOptions *)src->pixels);
    }
    std::__shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2> *)src,&_Stack_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_48._M_refcount);
    lVar2 = std::chrono::_V2::system_clock::now();
    std::operator<<((ostream *)&std::cout,"Stage: Ripple effect:    ");
    poVar3 = std::ostream::_M_insert<double>((double)(lVar2 - lVar1) * 1e-09);
    poVar3 = std::operator<<(poVar3," s.");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  if (*(char *)(in_RDX + 0x20) == '\x01') {
    lVar1 = std::chrono::_V2::system_clock::now();
    if ((WaterEffectOptions *)src->pixels == (WaterEffectOptions *)0x0) {
      runBlurStage((Image *)&_Stack_48,options);
    }
    else {
      runBlurStage((Image *)&_Stack_48,(WaterEffectOptions *)src->pixels);
    }
    std::__shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2> *)src,&_Stack_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_48._M_refcount);
    lVar2 = std::chrono::_V2::system_clock::now();
    std::operator<<((ostream *)&std::cout,"Stage: Blur:             ");
    poVar3 = std::ostream::_M_insert<double>((double)(lVar2 - lVar1) * 1e-09);
    poVar3 = std::operator<<(poVar3," s.");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&hist.super___shared_ptr<Histogram,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  sVar4.super___shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi
  ;
  sVar4.super___shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr = src;
  return (shared_ptr<Image>)sVar4.super___shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Image> runWaterEffect(const Image *src, const WaterEffectOptions *options) {
  // Stage timer
  Timer ts;

  // Smart pointers to intermediate images:
  std::shared_ptr<Histogram> hist;
  std::shared_ptr<Image> img_result;

  // Histogram stage
  if (options->histogram) {
    ts.start();
    hist = runHistogramStage(src, options);
    ts.stop();
    std::cout << "Stage: Histogram:        " << ts.seconds() << " s." << std::endl;
  }

  // Contrast enhancement stage
  if (options->enhance) {
    ts.start();
    if (hist == nullptr) {
      throw std::runtime_error("Cannot run enhance stage without histogram.");
    }
    img_result = runEnhanceStage(src, hist.get(), options);
    ts.stop();
    std::cout << "Stage: Contrast enhance: " << ts.seconds() << " s." << std::endl;
  }

  // Ripple effect stage
  if (options->ripple) {
    ts.start();
    if (img_result == nullptr) {
      img_result = runRippleStage(src, options);
    } else {
      img_result = runRippleStage(img_result.get(), options);
    }
    ts.stop();
    std::cout << "Stage: Ripple effect:    " << ts.seconds() << " s." << std::endl;
  }

  // Gaussian blur stage
  if (options->blur) {
    ts.start();
    if (img_result == nullptr) {
      img_result = runBlurStage(src, options);
    } else {
      img_result = runBlurStage(img_result.get(), options);
    }
    ts.stop();
    std::cout << "Stage: Blur:             " << ts.seconds() << " s." << std::endl;
  }

  return img_result;
}